

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

void __thiscall
booster::aio::stream_socket::async_read(stream_socket *this,mutable_buffer *buffer,io_handler *h)

{
  mutable_buffer *buffer_00;
  reader_all *prVar1;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> iVar2;
  atomic_counter *this_00;
  bool bVar3;
  pointer_type this_01;
  size_t n;
  io_service *this_02;
  error_code e;
  error_code local_70;
  mutable_buffer local_60;
  
  bVar3 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar3) {
    this_01.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x58);
    ((this_01.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_001cef10;
    this_00 = (atomic_counter *)((long)&(this_01.p_)->super_refcounted + 8);
    atomic_counter::atomic_counter(this_00,0);
    ((this_01.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__reader_all_001cf3e0;
    iVar2.p_ = (reader_all *)(buffer->super_buffer_impl<char_*>).entry_.ptr;
    this_01.p_[1].super_refcounted._vptr_refcounted =
         (_func_int **)*(reader_all **)&buffer->super_buffer_impl<char_*>;
    *(reader_all **)((long)(this_01.p_ + 1) + 8) = iVar2.p_;
    this_01.p_[2].super_refcounted._vptr_refcounted =
         (_func_int **)(buffer->super_buffer_impl<char_*>).entry_.size;
    std::
    vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ::vector((vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
              *)((long)(this_01.p_ + 2) + 8),&(buffer->super_buffer_impl<char_*>).vec_);
    this_01.p_[4].super_refcounted._vptr_refcounted = (_func_int **)0x0;
    *(stream_socket **)((long)(this_01.p_ + 4) + 8) = this;
    prVar1 = (reader_all *)(h->call_ptr).p_;
    this_01.p_[5].super_refcounted._vptr_refcounted = (_func_int **)prVar1;
    if (prVar1 != (reader_all *)0x0) {
      atomic_counter::inc(&(prVar1->super_callable<void_(const_std::error_code_&)>).super_refcounted
                           .refs_);
    }
    buffer_00 = (mutable_buffer *)(this_01.p_ + 1);
    atomic_counter::inc(this_00);
    local_70._M_value = 0;
    local_70._M_cat = (error_category *)std::_V2::system_category();
    n = read_some((stream_socket *)*(reader_all **)((long)(this_01.p_ + 4) + 8),buffer_00,&local_70)
    ;
    this_01.p_[4].super_refcounted._vptr_refcounted =
         (_func_int **)
         ((long)&(((reader_all *)this_01.p_[4].super_refcounted._vptr_refcounted)->
                 super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted +
         n);
    details::advance<booster::aio::mutable_buffer>(&local_60,buffer_00,n);
    this_01.p_[2].super_refcounted._vptr_refcounted =
         (_func_int **)local_60.super_buffer_impl<char_*>.entry_.size;
    (buffer_00->super_buffer_impl<char_*>).size_ = local_60.super_buffer_impl<char_*>.size_;
    *(undefined4 *)&(buffer_00->super_buffer_impl<char_*>).field_0x4 =
         local_60.super_buffer_impl<char_*>._4_4_;
    *(char **)((long)(this_01.p_ + 1) + 8) = local_60.super_buffer_impl<char_*>.entry_.ptr;
    iVar2.p_ = *(reader_all **)((long)(this_01.p_ + 2) + 8);
    *(pointer *)((long)(this_01.p_ + 2) + 8) =
         local_60.super_buffer_impl<char_*>.vec_.
         super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    this_01.p_[3].super_refcounted._vptr_refcounted =
         (_func_int **)
         local_60.super_buffer_impl<char_*>.vec_.
         super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)((long)(this_01.p_ + 3) + 8) =
         local_60.super_buffer_impl<char_*>.vec_.
         super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_60.super_buffer_impl<char_*>.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.super_buffer_impl<char_*>.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.super_buffer_impl<char_*>.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((iVar2.p_ != (reader_all *)0x0) &&
       (operator_delete(iVar2.p_),
       local_60.super_buffer_impl<char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_60.super_buffer_impl<char_*>.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (((buffer_00->super_buffer_impl<char_*>).size_ == 0) ||
       ((local_70._M_value != 0 && (bVar3 = basic_io_device::would_block(&local_70), !bVar3)))) {
      this_02 = basic_io_device::get_io_service
                          ((basic_io_device *)*(reader_all **)((long)(this_01.p_ + 4) + 8));
      io_service::post(this_02,(io_handler *)(this_01.p_ + 5),&local_70,
                       (size_t)this_01.p_[4].super_refcounted._vptr_refcounted);
    }
    else {
      iVar2.p_ = *(reader_all **)((long)(this_01.p_ + 4) + 8);
      atomic_counter::inc(this_00);
      local_60.super_buffer_impl<char_*>._0_8_ = this_01.p_;
      atomic_counter::inc(this_00);
      basic_io_device::on_readable((basic_io_device *)iVar2.p_,(event_handler *)&local_60);
      intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_60);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *)this_01.p_);
    }
    intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr
              ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *)this_01.p_);
    return;
  }
  return;
}

Assistant:

void stream_socket::async_read(mutable_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;
	reader_all::pointer r(new reader_all(this,buffer,h));
	r->run();
}